

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void walRestartHdr(Wal *pWal,u32 salt1)

{
  u32 uVar1;
  WalCkptInfo *pWVar2;
  u32 in_ESI;
  Wal *in_RDI;
  u32 *aSalt;
  int i;
  WalCkptInfo *pInfo;
  Wal *pWal_00;
  int local_1c;
  
  pWVar2 = walCkptInfo(in_RDI);
  pWal_00 = (Wal *)(in_RDI->hdr).aSalt;
  in_RDI->nCkpt = in_RDI->nCkpt + 1;
  (in_RDI->hdr).mxFrame = 0;
  uVar1 = sqlite3Get4byte((u8 *)pWal_00);
  sqlite3Put4byte((uchar *)pWal_00,uVar1 + 1);
  (in_RDI->hdr).aSalt[1] = in_ESI;
  walIndexWriteHdr(pWal_00);
  pWVar2->nBackfill = 0;
  pWVar2->nBackfillAttempted = 0;
  pWVar2->aReadMark[1] = 0;
  for (local_1c = 2; local_1c < 5; local_1c = local_1c + 1) {
    pWVar2->aReadMark[local_1c] = 0xffffffff;
  }
  return;
}

Assistant:

static void walRestartHdr(Wal *pWal, u32 salt1){
  volatile WalCkptInfo *pInfo = walCkptInfo(pWal);
  int i;                          /* Loop counter */
  u32 *aSalt = pWal->hdr.aSalt;   /* Big-endian salt values */
  pWal->nCkpt++;
  pWal->hdr.mxFrame = 0;
  sqlite3Put4byte((u8*)&aSalt[0], 1 + sqlite3Get4byte((u8*)&aSalt[0]));
  memcpy(&pWal->hdr.aSalt[1], &salt1, 4);
  walIndexWriteHdr(pWal);
  pInfo->nBackfill = 0;
  pInfo->nBackfillAttempted = 0;
  pInfo->aReadMark[1] = 0;
  for(i=2; i<WAL_NREADER; i++) pInfo->aReadMark[i] = READMARK_NOT_USED;
  assert( pInfo->aReadMark[0]==0 );
}